

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Descriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindAnyType
          (AggregateOptionFinder *this,Message *param_1,string *prefix,string *name)

{
  int iVar1;
  Symbol SVar2;
  Symbol SVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)prefix);
  if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)prefix), iVar1 == 0)) &&
     (SVar2 = FindSymbol(this->builder_,name,true), SVar2.ptr_ != (SymbolBase *)0x0)) {
    SVar3.ptr_ = (SymbolBase *)(Descriptor *)0x0;
    if ((SVar2.ptr_)->symbol_type_ == '\x01') {
      SVar3 = SVar2;
    }
  }
  else {
    SVar3.ptr_ = (SymbolBase *)(Descriptor *)0x0;
  }
  return (Descriptor *)SVar3.ptr_;
}

Assistant:

const Descriptor* FindAnyType(const Message& /*message*/,
                                const std::string& prefix,
                                const std::string& name) const override {
    if (prefix != internal::kTypeGoogleApisComPrefix &&
        prefix != internal::kTypeGoogleProdComPrefix) {
      return nullptr;
    }
    assert_mutex_held(builder_->pool_);
    return builder_->FindSymbol(name).descriptor();
  }